

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O0

void __thiscall leveldb::Table::ReadMeta(Table *this,Footer *footer)

{
  RandomAccessFile *file;
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  BlockHandle *handle;
  Block *this_00;
  Comparator *comparator;
  bool local_d9;
  Slice local_c0;
  Slice local_b0;
  Slice local_a0;
  Slice local_90;
  allocator local_79;
  undefined1 local_78 [8];
  string key;
  Iterator *iter;
  Block *meta;
  undefined1 local_40 [8];
  BlockContents contents;
  ReadOptions opt;
  Footer *footer_local;
  Table *this_local;
  
  if ((this->rep_->options).filter_policy != (FilterPolicy *)0x0) {
    ReadOptions::ReadOptions((ReadOptions *)&contents.cachable);
    if (((this->rep_->options).paranoid_checks & 1U) != 0) {
      contents.cachable = true;
    }
    BlockContents::BlockContents((BlockContents *)local_40);
    file = this->rep_->file;
    handle = Footer::metaindex_handle(footer);
    ReadBlock((leveldb *)&meta,file,(ReadOptions *)&contents.cachable,handle,
              (BlockContents *)local_40);
    bVar2 = Status::ok((Status *)&meta);
    Status::~Status((Status *)&meta);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      this_00 = (Block *)operator_new(0x18);
      Block::Block(this_00,(BlockContents *)local_40);
      comparator = BytewiseComparator();
      key.field_2._8_8_ = Block::NewIterator(this_00,comparator);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_78,"filter.",&local_79);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      (*((this->rep_->options).filter_policy)->_vptr_FilterPolicy[2])();
      std::__cxx11::string::append(local_78);
      uVar1 = key.field_2._8_8_;
      Slice::Slice(&local_90,(string *)local_78);
      (**(code **)(*(long *)uVar1 + 0x28))(uVar1,&local_90);
      uVar3 = (**(code **)(*(long *)key.field_2._8_8_ + 0x10))();
      local_d9 = false;
      if ((uVar3 & 1) != 0) {
        local_a0 = (Slice)(**(code **)(*(long *)key.field_2._8_8_ + 0x40))();
        Slice::Slice(&local_b0,(string *)local_78);
        local_d9 = leveldb::operator==(&local_a0,&local_b0);
      }
      if (local_d9 != false) {
        local_c0 = (Slice)(**(code **)(*(long *)key.field_2._8_8_ + 0x48))();
        ReadFilter(this,&local_c0);
      }
      if (key.field_2._8_8_ != 0) {
        (**(code **)(*(long *)key.field_2._8_8_ + 8))();
      }
      if (this_00 != (Block *)0x0) {
        Block::~Block(this_00);
        operator_delete(this_00);
      }
      std::__cxx11::string::~string((string *)local_78);
    }
  }
  return;
}

Assistant:

void Table::ReadMeta(const Footer& footer) {
  if (rep_->options.filter_policy == nullptr) {
    return;  // Do not need any metadata
  }

  // TODO(sanjay): Skip this if footer.metaindex_handle() size indicates
  // it is an empty block.
  ReadOptions opt;
  if (rep_->options.paranoid_checks) {
    opt.verify_checksums = true;
  }
  BlockContents contents;
  if (!ReadBlock(rep_->file, opt, footer.metaindex_handle(), &contents).ok()) {
    // Do not propagate errors since meta info is not needed for operation
    return;
  }
  Block* meta = new Block(contents);

  Iterator* iter = meta->NewIterator(BytewiseComparator());
  std::string key = "filter.";
  key.append(rep_->options.filter_policy->Name());
  iter->Seek(key);
  if (iter->Valid() && iter->key() == Slice(key)) {
    ReadFilter(iter->value());
  }
  delete iter;
  delete meta;
}